

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::ListBoxHeader(char *label,int items_count,int height_in_items)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  float fVar4;
  ImVec2 local_8;
  
  iVar3 = 7;
  if (items_count < 7) {
    iVar3 = items_count;
  }
  if (-1 < height_in_items) {
    iVar3 = height_in_items;
  }
  fVar4 = (float)iVar3;
  if (iVar3 < items_count) {
    fVar4 = fVar4 + 0.4;
  }
  fVar1 = (GImGui->Style).ItemSpacing.y;
  local_8 = (ImVec2)((ulong)(uint)((GImGui->FontSize + fVar1) * fVar4 + fVar1) << 0x20);
  bVar2 = ListBoxHeader(label,&local_8);
  return bVar2;
}

Assistant:

bool ImGui::ListBoxHeader(const char* label, int items_count, int height_in_items)
{
    // Size default to hold ~7 items. Fractional number of items helps seeing that we can scroll down/up without looking at scrollbar.
    // However we don't add +0.40f if items_count <= height_in_items. It is slightly dodgy, because it means a dynamic list of items will make the widget resize occasionally when it crosses that size.
    // I am expecting that someone will come and complain about this behavior in a remote future, then we can advise on a better solution.
    if (height_in_items < 0)
        height_in_items = ImMin(items_count, 7);
    float height_in_items_f = height_in_items < items_count ? (height_in_items + 0.40f) : (height_in_items + 0.00f);

    // We include ItemSpacing.y so that a list sized for the exact number of items doesn't make a scrollbar appears. We could also enforce that by passing a flag to BeginChild().
    ImVec2 size;
    size.x = 0.0f;
    size.y = GetTextLineHeightWithSpacing() * height_in_items_f + GetStyle().ItemSpacing.y;
    return ListBoxHeader(label, size);
}